

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

string * __thiscall
tinyusdz::usdc::USDCReader::GetError_abi_cxx11_(string *__return_storage_ptr__,USDCReader *this)

{
  USDCReader *this_local;
  
  Impl::GetError_abi_cxx11_(__return_storage_ptr__,this->impl_);
  return __return_storage_ptr__;
}

Assistant:

std::string USDCReader::GetError() { return impl_->GetError(); }